

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O2

int fiobj_hash_haskey(FIOBJ hash,FIOBJ key)

{
  uint64_t hash_value;
  FIOBJ FVar1;
  
  if (((uint)hash & 7) == 4) {
    hash_value = fiobj_obj2hash(key);
    FVar1 = fio_hash___find((fio_hash___s *)((hash & 0xfffffffffffffff8) + 8),hash_value,key);
    return (int)(FVar1 != 0);
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_hash.c"
                ,0x141,"int fiobj_hash_haskey(const FIOBJ, FIOBJ)");
}

Assistant:

int fiobj_hash_haskey(const FIOBJ hash, FIOBJ key) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  return fio_hash___find(&obj2hash(hash)->hash, fiobj_obj2hash(key), key) !=
         FIOBJ_INVALID;
}